

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O1

void __thiscall
CTestGen9Resource_Test1DLinearResourceMips_Test::TestBody
          (CTestGen9Resource_Test1DLinearResourceMips_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  long lVar1;
  CTestGen9Resource_Test1DLinearResourceMips_Test *this_01;
  bool bVar2;
  undefined4 uVar3;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  long lVar17;
  undefined1 in_XMM4 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long lVar21;
  undefined1 in_XMM5 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  undefined1 in_XMM11 [16];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_128;
  undefined8 uStack_120;
  ulong local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  CTestGen9Resource_Test1DLinearResourceMips_Test *local_d0;
  undefined1 local_c8 [8];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ulong local_60;
  uint local_58;
  uint local_54;
  uint32_t StartOfMip;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  local_f8 = 0;
  uStack_140 = 0;
  uStack_110 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_158 = 1;
  uStack_f0 = 0x100000000;
  uStack_150 = 0x400000000;
  local_148 = 0x80000;
  local_118 = 5;
  this_00 = &gtest_ar.message_;
  local_60 = 0;
  local_d0 = this;
  do {
    uVar8 = (uint)local_60;
    uVar3 = 0;
    if (uVar8 < 5) {
      uVar3 = (&DAT_001ad00c)[local_60];
    }
    local_158 = CONCAT44(uVar3,(undefined4)local_158);
    local_128 = 0x100;
    uStack_120 = CONCAT44(uStack_120._4_4_,1);
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&local_158);
    this_01 = local_d0;
    uVar4 = (int)local_128 + 0x3fU & 0xffffffc0;
    if ((int)local_118 != 0) {
      lVar6 = (ulong)((int)local_118 + 1) - 2;
      auVar15._8_4_ = (int)lVar6;
      auVar15._0_8_ = lVar6;
      auVar15._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar20._8_4_ = (int)local_128;
      auVar20._0_8_ = local_128;
      auVar20._12_4_ = (int)(local_128 >> 0x20);
      lVar6 = 4;
      auVar18 = pmovsxbq(in_XMM4,0x201);
      auVar22 = pmovsxbq(in_XMM5,0x403);
      in_XMM9 = pmovsxbd(in_XMM9,0x3f3f3f3f);
      in_XMM10 = pmovsxbd(in_XMM10,0xc0c0c0c0);
      in_XMM11 = pmovsxbq(in_XMM11,0x404);
      auVar13 = ZEXT416(uVar4);
      do {
        auVar11 = auVar13;
        lVar17 = auVar18._0_8_;
        uVar9 = auVar20._8_8_;
        auVar23._0_8_ = local_128 >> lVar17;
        auVar23._8_8_ = uVar9 >> lVar17;
        lVar16 = auVar18._8_8_;
        auVar12._0_8_ = local_128 >> lVar16;
        auVar12._8_8_ = uVar9 >> lVar16;
        auVar13 = pblendw(auVar12,auVar23,0xf);
        lVar21 = auVar22._0_8_;
        auVar24._0_8_ = local_128 >> lVar21;
        auVar24._8_8_ = uVar9 >> lVar21;
        lVar1 = auVar22._8_8_;
        auVar25._0_8_ = local_128 >> lVar1;
        auVar25._8_8_ = uVar9 >> lVar1;
        auVar18 = pblendw(auVar25,auVar24,0xf);
        auVar14._0_4_ = auVar13._0_4_ + in_XMM9._0_4_;
        auVar14._4_4_ = auVar13._8_4_ + in_XMM9._4_4_;
        auVar14._8_4_ = auVar18._0_4_ + in_XMM9._8_4_;
        auVar14._12_4_ = auVar18._8_4_ + in_XMM9._12_4_;
        auVar14 = auVar14 & in_XMM10;
        auVar13._0_4_ = auVar14._0_4_ + auVar11._0_4_;
        auVar13._4_4_ = auVar14._4_4_ + auVar11._4_4_;
        auVar13._8_4_ = auVar14._8_4_ + auVar11._8_4_;
        auVar13._12_4_ = auVar14._12_4_ + auVar11._12_4_;
        auVar18._0_8_ = lVar17 + in_XMM11._0_8_;
        auVar18._8_8_ = lVar16 + in_XMM11._8_8_;
        auVar22._0_8_ = lVar21 + in_XMM11._0_8_;
        auVar22._8_8_ = lVar1 + in_XMM11._8_8_;
        lVar16 = (((ulong)((int)local_118 + 1) + 2 & 0xfffffffffffffffc) - 4) + lVar6;
        lVar6 = lVar6 + -4;
      } while (lVar16 != 4);
      lVar6 = -lVar6;
      auVar19._8_4_ = (int)lVar6;
      auVar19._0_8_ = lVar6;
      auVar19._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar20 = (auVar19 | _DAT_001aa8d0) ^ _DAT_001aa8c0;
      lVar6 = SUB168(auVar15 ^ _DAT_001aa8c0,0);
      in_XMM4._0_8_ = -(ulong)(lVar6 < auVar20._0_8_);
      lVar16 = SUB168(auVar15 ^ _DAT_001aa8c0,8);
      in_XMM4._8_8_ = -(ulong)(lVar16 < auVar20._8_8_);
      auVar20 = (auVar19 | _DAT_001aa8b0) ^ _DAT_001aa8c0;
      auVar10._0_8_ = -(ulong)(lVar6 < auVar20._0_8_);
      auVar10._8_8_ = -(ulong)(lVar16 < auVar20._8_8_);
      auVar20 = packssdw(auVar10,in_XMM4);
      auVar13 = blendvps(auVar13,auVar11,auVar20);
      auVar13 = phaddd(auVar13,auVar13);
      auVar13 = phaddd(auVar13,auVar13);
      uVar4 = auVar13._0_4_;
      in_XMM5 = _DAT_001aa8c0;
    }
    iVar5 = 0;
    if (uVar8 < 5) {
      iVar5 = (&DAT_001ad020)[local_60];
    }
    local_54 = uVar8;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)local_d0,ResourceInfo,0x40);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this_01,ResourceInfo,(ulong)(iVar5 * uVar4 + 0xfff & 0xfffff000));
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    stack0xffffffffffffff3c = SUB1612((undefined1  [16])0x0,4);
    local_c8._0_4_ = 1;
    _uStack_c0 = 0;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,local_c8);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_48,"0","OffsetInfo.Render.Offset64",(int *)this_00,(unsigned_long *)local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdc,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)this_00,(uint *)(local_98 + 8));
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdd,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)this_00,(uint *)(local_98 + 0xc));
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xde,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)this_00,(uint *)local_88);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar7 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar7 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdf,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_58 = 0;
    if ((int)local_118 != 0) {
      uVar9 = 1;
      do {
        local_78 = (undefined1  [16])0x0;
        local_88 = (undefined1  [16])0x0;
        local_98 = (undefined1  [16])0x0;
        local_a8 = (undefined1  [16])0x0;
        local_b8 = (undefined1  [16])0x0;
        stack0xffffffffffffff3c = SUB1612((undefined1  [16])0x0,4);
        local_c8._0_4_ = 1;
        uStack_c0 = (int)uVar9;
        uStack_bc = 0;
        (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,local_c8);
        iVar5 = 0;
        if (local_54 < 5) {
          iVar5 = (&DAT_001ad020)[local_60];
        }
        local_58 = local_58 +
                   ((int)(local_128 >> ((char)uVar9 - 1U & 0x3f)) + 0x3fU & 0xffffffc0) * iVar5;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  (local_48,"StartOfMip","OffsetInfo.Render.Offset64",&local_58,
                   (unsigned_long *)local_98);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar7 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar7 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0xea,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)this_00)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
            }
            gtest_ar.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  (local_48,"0","OffsetInfo.Render.XOffset",(int *)this_00,(uint *)(local_98 + 8));
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar7 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar7 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0xeb,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)this_00)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
            }
            gtest_ar.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  (local_48,"0","OffsetInfo.Render.YOffset",(int *)this_00,(uint *)(local_98 + 0xc))
        ;
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar7 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar7 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0xec,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)this_00)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
            }
            gtest_ar.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  (local_48,"0","OffsetInfo.Render.ZOffset",(int *)this_00,(uint *)local_88);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar7 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar7 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&StartOfMip,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0xed,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&StartOfMip,(Message *)this_00)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&StartOfMip);
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
            }
            gtest_ar.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar2 = uVar9 < (local_118 & 0xffffffff);
        uVar9 = uVar9 + 1;
      } while (bVar2);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
    local_60 = (ulong)(local_54 + 1);
  } while (local_54 + 1 != 5);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DLinearResourceMips)
{
    // Horizontal pixel alignment
    const uint32_t HAlign = 64;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.MaxLod               = 5;

    // Allocate 256x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x100;
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        for(int mip = 1; mip <= gmmParams.MaxLod; mip++)
        {
            // Since 1D doesn't have a height, mips are just based on width
            AlignedWidth += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> mip, HAlign);
        }
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        // Mip0 should be at offset 0. X/Y/Z Offset should be 0 for linear.
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // All mips should be right after one another linearly
        uint32_t StartOfMip = 0;
        for(int mip = 1; mip <= gmmParams.MaxLod; mip++)
        {
            OffsetInfo           = {};
            OffsetInfo.ReqRender = 1;
            OffsetInfo.MipLevel  = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            StartOfMip += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), HAlign) * GetBppValue(bpp);
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}